

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O2

void __thiscall
cppcms::impl::buddy_allocator::test_consistent
          (buddy_allocator *this,void **allocated,size_t allocated_size)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  runtime_error *prVar8;
  size_t sVar9;
  ulong uVar10;
  string local_200 [32];
  page *p;
  map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
  all_pages;
  ostringstream oss;
  
  all_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &all_pages._M_t._M_impl.super__Rb_tree_header._M_header;
  all_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  all_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  all_pages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  all_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       all_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  test_and_get_free_pages(this,&all_pages);
  sVar9 = 0;
  do {
    if (allocated_size == sVar9) {
      uVar3 = this->memory_size_;
      uVar10 = 0;
      p_Var6 = all_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        if ((_Rb_tree_header *)p_Var6 == &all_pages._M_t._M_impl.super__Rb_tree_header) {
          if (uVar3 - uVar10 < 0x20) {
            std::
            _Rb_tree<cppcms::impl::buddy_allocator::page_*,_std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>,_std::_Select1st<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
            ::~_Rb_tree(&all_pages._M_t);
            return;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar7 = std::operator<<((ostream *)&oss,"Error ");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xb6);
          std::operator<<(poVar7," memory_size_ - pos < size_t(alignment * 2)");
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar8,local_200);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar1 = **(uint **)(p_Var6 + 1);
        if ((uVar1 >> 8 & 1) == (uint)*(byte *)&p_Var6[1]._M_parent) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar7 = std::operator<<((ostream *)&oss,"Error ");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xaf);
          std::operator<<(poVar7," is_free == !(p->bits & page_in_use)");
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar8,local_200);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (uVar10 != (long)*(uint **)(p_Var6 + 1) - (long)(this + 1)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar7 = std::operator<<((ostream *)&oss,"Error ");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xb1);
          std::operator<<(poVar7," pos == page_pos");
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar8,local_200);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar10 = uVar10 + (1L << ((byte)uVar1 & 0x3f));
        if (uVar3 < uVar10) break;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar7 = std::operator<<((ostream *)&oss,"Error ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xb4);
      std::operator<<(poVar7," pos <= memory_size_");
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,local_200);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar2 = allocated[sVar9];
    if (pvVar2 != (void *)0x0) {
      p = (page *)((long)pvVar2 + -0x10);
      if ((*(byte *)((long)pvVar2 + -0xf) & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar7 = std::operator<<((ostream *)&oss,"Error ");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xa7);
        std::operator<<(poVar7," p->bits & page_in_use");
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,local_200);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar4 = std::
              _Rb_tree<cppcms::impl::buddy_allocator::page_*,_std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>,_std::_Select1st<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
              ::find(&all_pages._M_t,&p);
      if ((_Rb_tree_header *)iVar4._M_node != &all_pages._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar7 = std::operator<<((ostream *)&oss,"Error ");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xa8);
        std::operator<<(poVar7," all_pages.find(p)==all_pages.end()");
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,local_200);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pmVar5 = std::
               map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
               ::operator[]((map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
                             *)&all_pages._M_t,&p);
      *pmVar5 = false;
    }
    sVar9 = sVar9 + 1;
  } while( true );
}

Assistant:

void test_consistent(void * const *allocated,size_t allocated_size)
	{
		std::map<page *,bool> all_pages;
		test_and_get_free_pages(&all_pages);
		for(size_t i=0;i<allocated_size;i++) {
			if(allocated[i]==0)
				continue;
			page *p=reinterpret_cast<page *>(static_cast<char *>(allocated[i]) - alignment);
			TEST(p->bits & page_in_use);
			TEST(all_pages.find(p)==all_pages.end());
			all_pages[p]=false;
		}
		size_t pos = 0;
		for(std::map<page *,bool>::const_iterator pg=all_pages.begin();pg!=all_pages.end();++pg) {
			page *p=pg->first;
			bool is_free = pg->second;
			TEST(is_free == !(p->bits & page_in_use));
			size_t page_pos = reinterpret_cast<char *>(pg->first) - memory();
			TEST(pos == page_pos);
			size_t page_size = size_t(1) << (pg->first->bits & 0xFF);
			pos+= page_size;
			TEST(pos <= memory_size_);
		}
		TEST(memory_size_ - pos < size_t(alignment * 2));
	}